

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr
GetGenericClassTypeName(ExpressionContext *ctx,TypeBase *proto,IntrusiveList<TypeHandle> generics)

{
  TypeBase *pTVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  TypeHandle *pTVar6;
  TypeHandle *pTVar7;
  TypeHandle *pTVar8;
  ulong uVar9;
  TypeHandle *arg;
  char *__dest;
  InplaceStr IVar10;
  
  pTVar6 = generics.tail;
  pTVar8 = generics.head;
  uVar3 = (*(int *)&(proto->name).end - *(int *)&(proto->name).begin) + 3;
  pTVar7 = pTVar8;
  if (pTVar8 == (TypeHandle *)0x0) {
    uVar9 = 0;
  }
  else {
    do {
      pTVar1 = pTVar7->type;
      uVar9 = 7;
      if (pTVar1->isGeneric == false) {
        uVar9 = (ulong)(uint)(*(int *)&(pTVar1->name).end - *(int *)&(pTVar1->name).begin);
      }
      pTVar7 = pTVar7->next;
      uVar3 = (uint)(pTVar7 != (TypeHandle *)0x0) + uVar3 + (int)uVar9;
    } while (pTVar7 != (TypeHandle *)0x0);
    pTVar6 = (TypeHandle *)0x0;
  }
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar3,uVar9,pTVar6);
  IVar10.begin = (char *)CONCAT44(extraout_var,iVar4);
  pcVar2 = (proto->name).begin;
  memcpy(IVar10.begin,pcVar2,(ulong)(uint)(*(int *)&(proto->name).end - (int)pcVar2));
  pcVar2 = IVar10.begin + (uint)(*(int *)&(proto->name).end - *(int *)&(proto->name).begin);
  __dest = pcVar2 + 1;
  pcVar2[0] = '<';
  pcVar2[1] = '\0';
  for (; pTVar8 != (TypeHandle *)0x0; pTVar8 = pTVar8->next) {
    pTVar1 = pTVar8->type;
    if (pTVar1->isGeneric == true) {
      builtin_strncpy(__dest,"generic",8);
      uVar9 = 7;
    }
    else {
      pcVar2 = (pTVar1->name).begin;
      memcpy(__dest,pcVar2,(ulong)(uint)(*(int *)&(pTVar1->name).end - (int)pcVar2));
      uVar9 = (ulong)(uint)(*(int *)&(pTVar8->type->name).end - *(int *)&(pTVar8->type->name).begin)
      ;
    }
    __dest = __dest + uVar9;
    if (pTVar8->next != (TypeHandle *)0x0) {
      *__dest = ',';
      __dest = __dest + 1;
    }
  }
  __dest[0] = '>';
  __dest[1] = '\0';
  sVar5 = strlen(IVar10.begin);
  if (sVar5 + 1 == (ulong)uVar3) {
    IVar10.end = IVar10.begin + sVar5;
    return IVar10;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x108,
                "InplaceStr GetGenericClassTypeName(ExpressionContext &, TypeBase *, IntrusiveList<TypeHandle>)"
               );
}

Assistant:

InplaceStr GetGenericClassTypeName(ExpressionContext &ctx, TypeBase* proto, IntrusiveList<TypeHandle> generics)
{
	unsigned nameLength = proto->name.length() + unsigned(strlen("<>")) + 1;

	for(TypeHandle *arg = generics.head; arg; arg = arg->next)
	{
		if(arg->type->isGeneric)
			nameLength += unsigned(strlen("generic"));
		else
			nameLength += arg->type->name.length();

		if(arg->next)
			nameLength += 1;
	}

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, proto->name.begin, proto->name.length());
	pos += proto->name.length();

	strcpy(pos, "<");
	pos += 1;

	for(TypeHandle *arg = generics.head; arg; arg = arg->next)
	{
		if(arg->type->isGeneric)
		{
			strcpy(pos, "generic");
			pos += strlen("generic");
		}
		else
		{
			memcpy(pos, arg->type->name.begin, arg->type->name.length());
			pos += arg->type->name.length();
		}

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = '>';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}